

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O3

ElementList * __thiscall
lunasvg::Document::querySelectorAll
          (ElementList *__return_storage_ptr__,Document *this,string *content)

{
  byte *pbVar1;
  byte *pbVar2;
  pointer pvVar3;
  pointer pvVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  anon_class_16_2_c48942ba callback;
  SelectorList selectors;
  string_view local_68;
  SelectorList local_58;
  SelectorList local_38;
  
  pbVar2 = (byte *)(content->_M_dataplus)._M_p;
  local_68._M_len = content->_M_string_length;
  local_38.
  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.
  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.
  super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68._M_str = (char *)pbVar2;
  if (local_68._M_len != 0) {
    pbVar1 = pbVar2 + local_68._M_len;
    lVar6 = -local_68._M_len;
    do {
      if ((0x20 < (ulong)(byte)*local_68._M_str) ||
         ((0x100002600U >> ((ulong)(byte)*local_68._M_str & 0x3f) & 1) == 0)) {
        lVar7 = 0;
        goto LAB_0011a7b8;
      }
      local_68._M_str = (char *)((byte *)local_68._M_str + 1);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
    local_68._M_len = 0;
    local_68._M_str = (char *)pbVar1;
  }
  goto LAB_0011a7e0;
  while (bVar5 = lVar6 + 1 != lVar7, lVar7 = lVar7 + -1, bVar5) {
LAB_0011a7b8:
    if ((0x20 < (ulong)pbVar2[lVar7 + (local_68._M_len - 1)]) ||
       ((0x100002600U >> ((ulong)pbVar2[lVar7 + (local_68._M_len - 1)] & 0x3f) & 1) == 0)) {
      local_68._M_len = lVar7 - lVar6;
      goto LAB_0011a7e0;
    }
  }
  local_68._M_len = 0;
LAB_0011a7e0:
  bVar5 = parseSelectors(&local_68,&local_38);
  pvVar4 = local_38.
           super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pvVar3 = local_38.
           super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (bVar5 && local_68._M_len == 0) {
    local_58.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_38.
         super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_38.
         super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_58.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38.
         super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_38.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ::~vector(&local_38);
    if (pvVar3 != pvVar4) {
      (__return_storage_ptr__->
      super__Vector_base<lunasvg::Element,_std::allocator<lunasvg::Element>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<lunasvg::Element,_std::allocator<lunasvg::Element>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__return_storage_ptr__->
      super__Vector_base<lunasvg::Element,_std::allocator<lunasvg::Element>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      callback.elements = __return_storage_ptr__;
      callback.selectors = &local_58;
      SVGElement::
      transverse<lunasvg::Document::querySelectorAll(std::__cxx11::string_const&)const::__0>
                ((SVGElement *)
                 (this->m_rootElement)._M_t.
                 super___uniq_ptr_impl<lunasvg::SVGRootElement,_std::default_delete<lunasvg::SVGRootElement>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_lunasvg::SVGRootElement_*,_std::default_delete<lunasvg::SVGRootElement>_>
                 .super__Head_base<0UL,_lunasvg::SVGRootElement_*,_false>._M_head_impl,callback);
      goto LAB_0011a879;
    }
  }
  else {
    local_58.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.
    super__Vector_base<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
    ::~vector(&local_38);
  }
  (__return_storage_ptr__->super__Vector_base<lunasvg::Element,_std::allocator<lunasvg::Element>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lunasvg::Element,_std::allocator<lunasvg::Element>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<lunasvg::Element,_std::allocator<lunasvg::Element>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0011a879:
  std::
  vector<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>,_std::allocator<std::vector<lunasvg::SimpleSelector,_std::allocator<lunasvg::SimpleSelector>_>_>_>
  ::~vector(&local_58);
  return __return_storage_ptr__;
}

Assistant:

ElementList Document::querySelectorAll(const std::string& content) const
{
    auto selectors = parseQuerySelectors(content);
    if(selectors.empty())
        return ElementList();
    ElementList elements;
    m_rootElement->transverse([&](SVGElement* element) {
        for(const auto& selector : selectors) {
            if(matchSelector(selector, element)) {
                elements.push_back(element);
                break;
            }
        }
    });

    return elements;
}